

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evutil.c
# Opt level: O0

int parse_numeric_servname(char *servname)

{
  long lVar1;
  char *local_28;
  char *endptr;
  char *pcStack_18;
  int n;
  char *servname_local;
  
  local_28 = (char *)0x0;
  pcStack_18 = servname;
  lVar1 = strtol(servname,&local_28,10);
  servname_local._4_4_ = (int)lVar1;
  if ((((servname_local._4_4_ < 0) || (0xffff < servname_local._4_4_)) || (*pcStack_18 == '\0')) ||
     ((local_28 == (char *)0x0 || (*local_28 != '\0')))) {
    servname_local._4_4_ = -1;
  }
  return servname_local._4_4_;
}

Assistant:

static int
parse_numeric_servname(const char *servname)
{
	int n;
	char *endptr=NULL;
	n = (int) strtol(servname, &endptr, 10);
	if (n>=0 && n <= 65535 && servname[0] && endptr && !endptr[0])
		return n;
	else
		return -1;
}